

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

uint32_t __thiscall cfd::Psbt::AddTxInData(Psbt *this,UtxoData *utxo,uint32_t sequence)

{
  uint32_t uVar1;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  OutPoint outpoint;
  Script redeem_script;
  TxOut txout;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_138;
  OutPoint local_120;
  undefined1 local_f8 [80];
  Script local_a8;
  code *local_70 [3];
  Script local_58;
  
  cfd::core::OutPoint::OutPoint(&local_120,&utxo->txid,utxo->vout);
  cfd::core::TxOut::TxOut((TxOut *)local_70);
  local_138.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&local_a8);
  ConvertFromUtxoData(utxo,(OutPoint *)0x0,(TxOut *)local_70,&local_138,&local_a8,false,
                      (NetType *)0x0);
  uVar1 = AddTxIn(this,&local_120,sequence);
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)local_f8,(TxOut *)local_70);
  cfd::core::Psbt::SetTxInUtxo
            ((uint)this,(TxOutReference *)(ulong)uVar1,(Script *)local_f8,(vector *)&local_a8);
  local_f8._0_8_ = &PTR__AbstractTxOutReference_002b3160;
  core::Script::~Script((Script *)(local_f8 + 0x18));
  core::Script::~Script(&local_a8);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_138);
  local_70[0] = cfd::core::ExtPrivkey::IsValid;
  core::Script::~Script(&local_58);
  local_120.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b2f00;
  if (local_120.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

uint32_t Psbt::AddTxInData(const UtxoData& utxo, uint32_t sequence) {
  OutPoint outpoint(utxo.txid, utxo.vout);
  TxOut txout;
  std::vector<KeyData> key_list;
  Script redeem_script;
  ConvertFromUtxoData(utxo, nullptr, &txout, &key_list, &redeem_script);

  uint32_t index = AddTxIn(outpoint, sequence);
  try {
    cfd::core::Psbt::SetTxInUtxo(
        index, TxOutReference(txout), redeem_script, key_list);
  } catch (const CfdException& except) {
    struct wally_psbt* psbt_pointer;
    psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
    wally_psbt_remove_input(psbt_pointer, index);
    base_tx_ = cfd::core::Psbt::RebuildTransaction(wally_psbt_pointer_);
    throw except;
  }
  return index;
}